

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O3

void __thiscall amrex::StateData::setTimeLevel(StateData *this,Real time,Real dt_old,Real dt_new)

{
  TimeCenter TVar1;
  Real RVar2;
  double dVar3;
  
  TVar1 = StateDescriptor::timeType(this->desc);
  RVar2 = time;
  dVar3 = time - dt_old;
  if (TVar1 != Point) {
    RVar2 = dt_new + time;
    dVar3 = time;
  }
  (this->new_time).stop = RVar2;
  (this->new_time).start = time;
  (this->old_time).stop = dVar3;
  (this->old_time).start = time - dt_old;
  return;
}

Assistant:

void
StateData::setTimeLevel (Real time,
                         Real dt_old,
                         Real dt_new)
{
    if (desc->timeType() == StateDescriptor::Point)
    {
        new_time.start = new_time.stop = time;
        old_time.start = old_time.stop = time - dt_old;
    }
    else
    {
        new_time.start = time;
        new_time.stop  = time+dt_new;
        old_time.start = time-dt_old;
        old_time.stop  = time;
    }
}